

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValues_TestShell::
TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValues_TestShell
          (TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValues_TestShell *this)

{
  TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValues_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValues_TestShell_00347450;
  return;
}

Assistant:

TEST(MockReturnValueTest, LongIntegerReturnValueSetsDifferentValues)
{
    long int expected_value = 1;
    long int another_expected_value = 2;

    mock().expectOneCall("foo").andReturnValue(expected_value);
    mock().expectOneCall("foo").andReturnValue(another_expected_value);

    LONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getLongIntValue());
    LONGS_EQUAL(expected_value, mock().returnValue().getLongIntValue());
    LONGS_EQUAL(another_expected_value, mock().actualCall("foo").returnValue().getLongIntValue());
    LONGS_EQUAL(another_expected_value, mock().returnValue().getLongIntValue());
}